

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesShaft.cpp
# Opt level: O1

ChVariablesShaft * __thiscall
chrono::ChVariablesShaft::operator=(ChVariablesShaft *this,ChVariablesShaft *other)

{
  if (other != this) {
    ChVariables::operator=(&this->super_ChVariables,&other->super_ChVariables);
    this->m_shaft = other->m_shaft;
    this->m_inertia = other->m_inertia;
  }
  return this;
}

Assistant:

ChVariablesShaft& ChVariablesShaft::operator=(const ChVariablesShaft& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChVariables::operator=(other);

    // copy class data
    m_shaft = other.m_shaft;
    m_inertia = other.m_inertia;

    return *this;
}